

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

SXML_CHAR * str_unescape(SXML_CHAR *str)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  SXML_CHAR *str_local;
  
  if (str == (SXML_CHAR *)0x0) {
    str_local = (SXML_CHAR *)0x0;
  }
  else {
    local_1c = 0;
    for (local_20 = 0; str_local = str, str[local_20] != '\0'; local_20 = local_20 + 1) {
      if (str[local_20] == '\\') {
        local_20 = local_20 + 1;
      }
      str[local_1c] = str[local_20];
      local_1c = local_1c + 1;
    }
  }
  return str_local;
}

Assistant:

SXML_CHAR* str_unescape(SXML_CHAR* str)
{
	int i, j;

	if (str == NULL)
		return NULL;

	for (i = j = 0; str[j]; j++) {
		if (str[j] == C2SX('\\'))
			j++;
		str[i++] = str[j];
	}

	return str;
}